

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

void __thiscall
Control::setProperties
          (Control *this,int controlType,Link *controlLink,int linkStatus,double linkSetting,
          Node *controlNode,double nodeSetting,int controlLevelType,int timeSetting)

{
  int controlLevelType_local;
  double nodeSetting_local;
  Node *controlNode_local;
  double linkSetting_local;
  int linkStatus_local;
  Link *controlLink_local;
  int controlType_local;
  Control *this_local;
  
  *(int *)&(this->super_Element).field_0x2c = controlType;
  this->link = controlLink;
  if (linkStatus == 2) {
    this->setting = linkSetting;
  }
  else {
    this->status = linkStatus;
  }
  this->node = controlNode;
  this->head = nodeSetting;
  this->levelType = controlLevelType;
  this->time = timeSetting;
  return;
}

Assistant:

void Control::setProperties(int    controlType,
                            Link*  controlLink,
                            int    linkStatus,
                            double linkSetting,
                            Node*  controlNode,
                            double nodeSetting,
                            int    controlLevelType,
                            int    timeSetting)
{
    type = controlType;
    link = controlLink;
    if ( linkStatus != NO_STATUS ) status = linkStatus;
    else setting = linkSetting;
    node = controlNode;
    head = nodeSetting;
    levelType = (LevelType)controlLevelType;
    time = timeSetting;
}